

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O0

void __thiscall cmDependsC::TransformLine(cmDependsC *this,string *line)

{
  bool bVar1;
  char *string;
  char *local_b0;
  char *c;
  string arg;
  string newline;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60 [3];
  string local_48;
  iterator local_28;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20;
  const_iterator tri;
  string *line_local;
  cmDependsC *this_local;
  
  tri._M_node = (_Base_ptr)line;
  string = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::RegularExpression::find(&this->IncludeRegexTransform,string);
  if (bVar1) {
    cmsys::RegularExpression::match_abi_cxx11_(&local_48,&this->IncludeRegexTransform,3);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->TransformRules,&local_48);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree_const_iterator(&local_20,&local_28);
    std::__cxx11::string::~string((string *)&local_48);
    newline.field_2._8_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->TransformRules);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree_const_iterator(local_60,(iterator *)((long)&newline.field_2 + 8));
    bVar1 = std::operator==(&local_20,local_60);
    if (!bVar1) {
      cmsys::RegularExpression::match_abi_cxx11_
                ((string *)((long)&arg.field_2 + 8),&this->IncludeRegexTransform,1);
      cmsys::RegularExpression::match_abi_cxx11_((string *)&c,&this->IncludeRegexTransform,4);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->(&local_20);
      for (local_b0 = (char *)std::__cxx11::string::c_str(); *local_b0 != '\0';
          local_b0 = local_b0 + 1) {
        if (*local_b0 == '%') {
          std::__cxx11::string::operator+=((string *)(arg.field_2._M_local_buf + 8),(string *)&c);
        }
        else {
          std::__cxx11::string::operator+=((string *)(arg.field_2._M_local_buf + 8),*local_b0);
        }
      }
      std::__cxx11::string::operator=
                ((string *)tri._M_node,(string *)(arg.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&c);
      std::__cxx11::string::~string((string *)(arg.field_2._M_local_buf + 8));
    }
  }
  return;
}

Assistant:

void cmDependsC::TransformLine(std::string& line)
{
  // Check for a transform rule match.  Return if none.
  if(!this->IncludeRegexTransform.find(line.c_str()))
    {
    return;
    }
  TransformRulesType::const_iterator tri =
    this->TransformRules.find(this->IncludeRegexTransform.match(3));
  if(tri == this->TransformRules.end())
    {
    return;
    }

  // Construct the transformed line.
  std::string newline = this->IncludeRegexTransform.match(1);
  std::string arg = this->IncludeRegexTransform.match(4);
  for(const char* c = tri->second.c_str(); *c; ++c)
    {
    if(*c == '%')
      {
      newline += arg;
      }
    else
      {
      newline += *c;
      }
    }

  // Return the transformed line.
  line = newline;
}